

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O3

void __thiscall BufferedReader::thread_main(BufferedReader *this)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ReaderData *pRVar5;
  FileNameIterator *pFVar6;
  map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
  *this_00;
  pthread_mutex_t *__mutex;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_ReaderData_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_ReaderData_*>_>_>
  pVar7;
  int readerID;
  string nextFileName;
  int local_6c;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
  *local_48;
  condition_variable *local_40;
  pthread_mutex_t *local_38;
  
  if (this->m_terminated == false) {
    local_40 = &this->m_readCond;
    __mutex = (pthread_mutex_t *)&this->m_readersMtx;
    this_00 = &this->m_readers;
    local_48 = this_00;
    local_38 = __mutex;
    do {
      local_6c = WaitableSafeQueue<int>::pop(&this->m_readQueue);
      if (this->m_terminated == true) {
        return;
      }
      pRVar5 = getReader(this,local_6c);
      if (pRVar5 != (ReaderData *)0x0) {
        if (pRVar5->m_deleted == false) {
          iVar4 = pRVar5->m_readOffset;
          puVar1 = pRVar5->m_nextBlock[pRVar5->m_bufferIndex];
          iVar2 = (*pRVar5->_vptr_ReaderData[5])(pRVar5,puVar1 + iVar4,(ulong)pRVar5->m_blockSize);
          if (pRVar5->m_lastBlock == true) {
            pRVar5->m_firstBlock = true;
            pRVar5->m_lastBlock = false;
          }
          else if (pRVar5->m_firstBlock == true) {
            pRVar5->m_firstBlock = false;
          }
          if (iVar2 < 1) {
            pFVar6 = pRVar5->itr;
            if (pFVar6 != (FileNameIterator *)0x0) goto LAB_0017f314;
            pRVar5->m_eof = true;
LAB_0017f3b2:
            pRVar5->m_blockSize = (this->super_AbstractReader).m_blockSize;
            if (iVar2 == 0) {
              pRVar5->m_eof = true;
              iVar2 = 0;
            }
          }
          else {
            if ((iVar2 < (int)pRVar5->m_blockSize) &&
               (pFVar6 = pRVar5->itr, pFVar6 != (FileNameIterator *)0x0)) {
LAB_0017f314:
              (**pFVar6->_vptr_FileNameIterator)(&local_68);
              if ((local_60 != (pRVar5->m_streamName)._M_string_length) ||
                 ((local_60 != 0 &&
                  (iVar3 = bcmp(local_68,(pRVar5->m_streamName)._M_dataplus._M_p,local_60),
                  iVar3 != 0)))) {
                (*pRVar5->_vptr_ReaderData[6])(pRVar5);
                std::__cxx11::string::_M_assign((string *)&pRVar5->m_streamName);
                if (((pRVar5->m_streamName)._M_string_length == 0) ||
                   (iVar3 = (*pRVar5->_vptr_ReaderData[4])(pRVar5), (char)iVar3 == '\0')) {
                  pRVar5->m_eof = true;
                }
                else if (iVar2 == 0) {
                  pRVar5->m_firstBlock = true;
                  iVar2 = (*pRVar5->_vptr_ReaderData[5])
                                    (pRVar5,puVar1 + iVar4,
                                     (ulong)(this->super_AbstractReader).m_blockSize);
                  if (iVar2 < (int)(this->super_AbstractReader).m_blockSize) {
                    pRVar5->m_lastBlock = true;
                    pRVar5->m_eof = true;
                  }
                }
                else {
                  pRVar5->m_lastBlock = true;
                }
              }
              if (local_68 != local_58) {
                operator_delete(local_68,local_58[0] + 1);
              }
              goto LAB_0017f3b2;
            }
            pRVar5->m_blockSize = (this->super_AbstractReader).m_blockSize;
          }
          iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_readMtx);
          if (iVar4 != 0) {
            std::__throw_system_error(iVar4);
          }
          pRVar5->m_nextBlockSize = iVar2;
          std::condition_variable::notify_one();
          pthread_mutex_unlock((pthread_mutex_t *)&this->m_readMtx);
          this_00 = local_48;
          __mutex = local_38;
        }
        iVar4 = pthread_mutex_lock(__mutex);
        if (iVar4 != 0) {
          std::__throw_system_error(iVar4);
        }
        iVar4 = pRVar5->m_atQueue + -1;
        pRVar5->m_atQueue = iVar4;
        if ((iVar4 == 0 & pRVar5->m_deleted) == 1) {
          (*pRVar5->_vptr_ReaderData[1])(pRVar5);
          pVar7 = std::
                  _Rb_tree<int,_std::pair<const_int,_ReaderData_*>,_std::_Select1st<std::pair<const_int,_ReaderData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
                  ::equal_range(&this_00->_M_t,&local_6c);
          std::
          _Rb_tree<int,_std::pair<const_int,_ReaderData_*>,_std::_Select1st<std::pair<const_int,_ReaderData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
          ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar7.first._M_node,
                         (_Base_ptr)pVar7.second._M_node);
        }
        pthread_mutex_unlock(__mutex);
      }
    } while (this->m_terminated == false);
  }
  return;
}

Assistant:

void BufferedReader::thread_main()
{
    try
    {
        while (!m_terminated)
        {
            const int readerID = m_readQueue.pop();
            if (m_terminated)
            {
                break;
            }
            ReaderData* data = getReader(readerID);
            if (data)
            {
                uint8_t* buffer = data->m_nextBlock[data->m_bufferIndex] + data->m_readOffset;
                if (!data->m_deleted)
                {
                    int bytesReaded = data->readBlock(buffer, data->m_blockSize);
                    if (data->m_lastBlock)
                    {
                        data->m_lastBlock = false;
                        data->m_firstBlock = true;
                    }
                    else if (data->m_firstBlock)
                    {
                        data->m_firstBlock = false;
                    }

                    if (bytesReaded <= 0 || (bytesReaded < static_cast<int>(data->m_blockSize) && data->itr))
                    {
                        if (data->itr)
                        {
                            std::string nextFileName = data->itr->getNextName();
                            if (nextFileName != data->m_streamName)
                            {
                                data->closeStream();
                                data->m_streamName = nextFileName;
                                if (!data->m_streamName.empty() && data->openStream())
                                {
                                    if (bytesReaded == 0)
                                    {
                                        // data->m_nextFileInfo = NEXT_FILE_FIRST_BLOCK;
                                        data->m_firstBlock = true;
                                        bytesReaded = data->readBlock(buffer, m_blockSize);
                                        if (bytesReaded < static_cast<int>(m_blockSize))
                                        {
                                            data->m_eof = true;
                                            data->m_lastBlock = true;
                                        }
                                    }
                                    else
                                    {
                                        data->m_lastBlock = true;
                                    }
                                }
                                else
                                    data->m_eof = true;
                            }
                        }
                        else
                        {
                            data->m_eof = true;
                        }
                    }

                    data->m_blockSize = m_blockSize;
                    if (bytesReaded == 0)
                    {
                        data->m_eof = true;
                    }

                    {
                        std::lock_guard lk(m_readMtx);
                        data->m_nextBlockSize = bytesReaded;
                        m_readCond.notify_one();
                    }
                }

                {
                    std::lock_guard lock(m_readersMtx);
                    data->m_atQueue--;
                    if (data->m_deleted && data->m_atQueue == 0)
                    {
                        delete data;
                        m_readers.erase(readerID);
                    }
                }
            }
        }
    }
    catch (std::exception& e)
    {
        LTRACE(LT_ERROR, 0, "BufferedReader::thread_main() throws exception: " << e.what());
    }
    catch (...)
    {
        LTRACE(LT_ERROR, 0, "BufferedReader::thread_main() throws unknown exception");
    }
}